

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::dht_get_peers_alert::~dht_get_peers_alert(dht_get_peers_alert *this)

{
  dht_get_peers_alert *this_local;
  
  libtorrent::alert::~alert(&this->super_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_get_peers_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT dht_get_peers_alert(aux::stack_allocator& alloc, sha1_hash const& ih);

		TORRENT_DEFINE_ALERT(dht_get_peers_alert, 56)

		static inline constexpr alert_category_t static_category = alert_category::dht;
		std::string message() const override;

		sha1_hash info_hash;
	}